

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContext.cpp
# Opt level: O0

bool JsrtContext::TrySetCurrent(JsrtContext *context)

{
  JsrtContext *this;
  bool bVar1;
  ScriptContext *pSVar2;
  ThreadContext *threadContext_00;
  long lVar3;
  Recycler *pRVar4;
  JsrtContext *originalContext;
  ThreadContext *threadContext;
  JsrtContext *context_local;
  
  if (context == (JsrtContext *)0x0) {
    bVar1 = ThreadContextTLSEntry::ClearThreadContext(true);
    if (!bVar1) {
      return false;
    }
  }
  else {
    pSVar2 = GetScriptContext(context);
    threadContext_00 = Js::ScriptContext::GetThreadContext(pSVar2);
    bVar1 = ThreadContextTLSEntry::TrySetThreadContext(threadContext_00);
    if (!bVar1) {
      return false;
    }
    lVar3 = __tls_get_addr(&PTR_01e57de8);
    if (*(JsrtContext **)(lVar3 + 0x48) == context) {
      return true;
    }
    pRVar4 = ThreadContext::GetRecycler(threadContext_00);
    Memory::Recycler::RootAddRef(pRVar4,context,(uint *)0x0);
  }
  lVar3 = __tls_get_addr(&PTR_01e57de8);
  this = *(JsrtContext **)(lVar3 + 0x48);
  if (this != (JsrtContext *)0x0) {
    pSVar2 = GetScriptContext(this);
    pRVar4 = Js::ScriptContext::GetRecycler(pSVar2);
    Memory::Recycler::RootRelease(pRVar4,this,(uint *)0x0);
  }
  lVar3 = __tls_get_addr(&PTR_01e57de8);
  *(JsrtContext **)(lVar3 + 0x48) = context;
  return true;
}

Assistant:

bool JsrtContext::TrySetCurrent(JsrtContext * context)
{
    ThreadContext * threadContext;

    //We are not pinning the context after SetCurrentContext, so if the context is not pinned
    //it might be reclaimed half way during execution. In jsrtshell the runtime was optimized out
    //at time of JsrtContext::Run by the compiler.
    //The change is to pin the context at setconcurrentcontext, and unpin the previous one. In
    //JsDisposeRuntime we'll reject if current context is active, so that will make sure all
    //contexts are unpinned at time of JsDisposeRuntime.
    if (context != nullptr)
    {
        threadContext = context->GetScriptContext()->GetThreadContext();

        if (!ThreadContextTLSEntry::TrySetThreadContext(threadContext))
        {
            return false;
        }
        // no need to rootAddRef and Release for the same context
        if (s_tlvSlot == context) return true;

        threadContext->GetRecycler()->RootAddRef((LPVOID)context);
    }
    else
    {
        if (!ThreadContextTLSEntry::ClearThreadContext(true))
        {
            return false;
        }
    }

    JsrtContext* originalContext = s_tlvSlot;
    if (originalContext != nullptr)
    {
        originalContext->GetScriptContext()->GetRecycler()->RootRelease((LPVOID) originalContext);
    }

    s_tlvSlot = context;
    return true;
}